

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_cpcall(lua_State *L,lua_CFunction func,void *ud)

{
  byte bVar1;
  uint64_t uVar2;
  int iVar3;
  
  uVar2 = (L->glref).ptr64;
  bVar1 = *(byte *)(uVar2 + 0x91);
  iVar3 = lj_vm_cpcall();
  if (iVar3 != 0) {
    *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) & 0xf | bVar1 & 0xf0;
  }
  return iVar3;
}

Assistant:

LUA_API int lua_cpcall(lua_State *L, lua_CFunction func, void *ud)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  int status;
  lj_checkapi(L->status == LUA_OK || L->status == LUA_ERRERR,
	      "thread called in wrong state %d", L->status);
  status = lj_vm_cpcall(L, func, ud, cpcall);
  if (status) hook_restore(g, oldh);
  return status;
}